

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool sense_stuff(effect_handler_context_t_conflict *context,_func__Bool_object_ptr *pred,
                 object_kind *unknown_kind)

{
  char cVar1;
  _Bool _Var2;
  int iVar3;
  loc grid;
  object *obj;
  object_kind *in_RCX;
  int iVar4;
  int iVar5;
  int iVar6;
  int y;
  int iVar7;
  int x;
  bool bVar8;
  
  iVar3 = (player->grid).x;
  iVar6 = (player->grid).y;
  y = iVar6 - (int)context;
  iVar6 = iVar6 + (int)context;
  iVar5 = iVar3 - (int)pred;
  iVar4 = 0;
  if (y < 1) {
    y = iVar4;
  }
  if (iVar5 < 1) {
    iVar5 = iVar4;
  }
  iVar7 = cave->height + -1;
  if (iVar6 < cave->height) {
    iVar7 = iVar6;
  }
  if (y <= iVar7) {
    iVar3 = iVar3 + (int)pred;
    iVar6 = cave->width + -1;
    if (iVar3 < cave->width) {
      iVar6 = iVar3;
    }
    iVar4 = 0;
    do {
      iVar3 = iVar4;
      x = iVar5;
      if (iVar5 <= iVar6) {
        do {
          grid = (loc)loc(x,y);
          obj = square_object(cave,grid);
          iVar4 = iVar3;
          if (iVar3 == 0) {
            for (; iVar4 = iVar3, obj != (object *)0x0; obj = obj->next) {
              cVar1 = (*(code *)unknown_kind)(obj);
              if (cVar1 != '\0') {
                iVar4 = 1;
                if (((obj->known == (object *)0x0) || (obj->known->kind == in_RCX)) ||
                   (_Var2 = ignore_item_ok(player,obj), !_Var2)) break;
              }
            }
          }
          square_sense_pile(cave,grid,(_func__Bool_object_ptr *)unknown_kind);
          bVar8 = x != iVar6;
          iVar3 = iVar4;
          x = x + 1;
        } while (bVar8);
      }
      bVar8 = y != iVar7;
      y = y + 1;
    } while (bVar8);
  }
  return SUB41(iVar4,0);
}

Assistant:

static bool sense_stuff(effect_handler_context_t *context,
		bool (*pred)(const struct object*),
		const struct object_kind *unknown_kind)
{
	int x, y;
	int x1, x2, y1, y2;

	bool have_stuff = false;

	/* Pick an area to sense */
	y1 = player->grid.y - context->y;
	y2 = player->grid.y + context->y;
	x1 = player->grid.x - context->x;
	x2 = player->grid.x + context->x;

	if (y1 < 0) y1 = 0;
	if (x1 < 0) x1 = 0;
	if (y2 > cave->height - 1) y2 = cave->height - 1;
	if (x2 > cave->width - 1) x2 = cave->width - 1;

	/* Scan the area */
	for (y = y1; y <= y2; y++) {
		for (x = x1; x <= x2; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(cave, grid);

			for (; !have_stuff && obj; obj = obj->next) {
				if ((*pred)(obj)
						&& (!obj->known
						|| obj->known->kind == unknown_kind
						|| !ignore_item_ok(player, obj))) {
					have_stuff = true;
				}
			}

			/*
			 * Become aware of the parts of the pile that match
			 * the predicate.  Forget remembered parts that match
			 * the predicate which are no longer there.
			 */
			square_sense_pile(cave, grid, pred);
		}
	}

	return have_stuff;
}